

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_rounding_unconditional(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  ulong uVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  int k_count;
  long lVar19;
  int iVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  int iVar24;
  float *pfVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  float *pfVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  float fVar55;
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  undefined1 in_ZMM13 [64];
  float fVar60;
  int data_width;
  int local_84;
  
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  auVar52._8_4_ = 0x80000000;
  auVar52._0_8_ = 0x8000000080000000;
  auVar52._12_4_ = 0x80000000;
  fVar55 = ipoint->scale;
  pfVar22 = iimage->data;
  iVar3 = iimage->data_width;
  lVar29 = 0;
  iVar24 = -0xc;
  auVar40 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->x),auVar52,0xf8);
  auVar41 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->y),auVar52,0xf8);
  auVar42 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)fVar55),auVar52,0xf8);
  auVar47._0_8_ = (double)fVar55;
  auVar47._8_8_ = 0;
  auVar40 = ZEXT416((uint)(ipoint->x + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = ZEXT416((uint)(auVar41._0_4_ + ipoint->y));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = ZEXT416((uint)(fVar55 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar45._0_8_ = (double)auVar40._0_4_;
  auVar45._8_8_ = auVar40._8_8_;
  auVar43._0_8_ = (double)auVar41._0_4_;
  auVar43._8_8_ = auVar41._8_8_;
  iVar14 = (int)auVar42._0_4_;
  auVar40._0_4_ = (int)auVar42._0_4_;
  auVar40._4_4_ = (int)auVar42._4_4_;
  auVar40._8_4_ = (int)auVar42._8_4_;
  auVar40._12_4_ = (int)auVar42._12_4_;
  auVar41 = vfmadd231sd_fma(auVar45,auVar47,ZEXT816(0x3fe0000000000000));
  auVar42 = vfmadd231sd_fma(auVar43,auVar47,ZEXT816(0x3fe0000000000000));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar46._8_4_ = 0x3effffff;
  auVar46._0_8_ = 0x3effffff3effffff;
  auVar46._12_4_ = 0x3effffff;
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  pfVar16 = haarResponseX;
  pfVar30 = haarResponseY;
  do {
    auVar49._0_4_ = (float)iVar24;
    auVar49._4_12_ = in_ZMM13._4_12_;
    lVar19 = 0;
    auVar45 = vfmadd213ss_fma(auVar49,ZEXT416((uint)fVar55),
                              ZEXT416((uint)((float)auVar42._0_8_ - auVar40._0_4_)));
    auVar43 = vpternlogd_avx512vl(auVar46,auVar45,auVar48,0xf8);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar43._0_4_));
    auVar45 = vroundss_avx(auVar45,auVar45,0xb);
    iVar38 = (int)auVar45._0_4_;
    iVar39 = (iVar38 + -1) * iVar3;
    iVar31 = (iVar38 + -1 + iVar14) * iVar3;
    iVar38 = (iVar38 + -1 + iVar14 * 2) * iVar3;
    do {
      auVar50._0_4_ = (float)((int)lVar19 + -0xc);
      auVar50._4_12_ = in_ZMM13._4_12_;
      auVar45 = vfmadd213ss_fma(auVar50,ZEXT416((uint)fVar55),
                                ZEXT416((uint)((float)auVar41._0_8_ - auVar40._0_4_)));
      auVar43 = vpternlogd_avx512vl(auVar46,auVar45,auVar48,0xf8);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar43._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      iVar33 = (int)auVar45._0_4_;
      iVar34 = iVar33 + -1 + iVar14;
      iVar20 = iVar33 + -1 + iVar14 * 2;
      fVar1 = pfVar22[iVar38 + -1 + iVar33];
      fVar2 = pfVar22[iVar39 + iVar20];
      auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar39 + iVar34] - pfVar22[iVar34 + iVar38]))
                                ,SUB6416(ZEXT464(0x40000000),0),
                                ZEXT416((uint)(pfVar22[iVar20 + iVar38] -
                                              pfVar22[iVar39 + -1 + iVar33])));
      auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar22[iVar31 + -1 + iVar33] -
                                              pfVar22[iVar31 + iVar20])),
                                SUB6416(ZEXT464(0x40000000),0),
                                ZEXT416((uint)(pfVar22[iVar20 + iVar38] -
                                              pfVar22[iVar39 + -1 + iVar33])));
      pfVar16[lVar19] = (fVar1 - fVar2) + auVar45._0_4_;
      pfVar30[lVar19] = auVar43._0_4_ - (fVar1 - fVar2);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x18);
    pfVar30 = pfVar30 + 0x18;
    pfVar16 = pfVar16 + 0x18;
    iVar24 = iVar24 + 1;
    lVar29 = lVar29 + 1;
  } while (lVar29 != 0x18);
  fVar60 = -0.08 / (fVar55 * fVar55);
  auVar40 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 0.5)),auVar52,0xf8);
  auVar40 = ZEXT416((uint)(fVar55 * 0.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 1.5)),auVar52,0xf8);
  auVar41 = ZEXT416((uint)(fVar55 * 1.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 2.5)),auVar52,0xf8);
  auVar42 = ZEXT416((uint)(fVar55 * 2.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar44 = vsubss_avx512f(auVar42,auVar40);
  auVar45 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 3.5)),auVar52,0xf8);
  auVar45 = ZEXT416((uint)(fVar55 * 3.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar43 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 4.5)),auVar52,0xf8);
  auVar43 = ZEXT416((uint)(auVar43._0_4_ + fVar55 * 4.5));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 5.5)),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(fVar55 * 5.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 6.5)),auVar52,0xf8);
  auVar47 = ZEXT416((uint)(fVar55 * 6.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 7.5)),auVar52,0xf8);
  auVar48 = ZEXT416((uint)(fVar55 * 7.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 8.5)),auVar52,0xf8);
  auVar49 = ZEXT416((uint)(fVar55 * 8.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 9.5)),auVar52,0xf8);
  auVar50 = ZEXT416((uint)(fVar55 * 9.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 10.5)),auVar52,0xf8);
  auVar52 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)(fVar55 * 11.5)),auVar52,0xf8);
  fVar58 = auVar42._0_4_;
  fVar1 = fVar58 + auVar40._0_4_;
  fVar4 = fVar58 - auVar45._0_4_;
  auVar40 = ZEXT416((uint)(fVar55 * 10.5 + auVar51._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  fVar5 = fVar58 - auVar41._0_4_;
  fVar2 = fVar58 + auVar41._0_4_;
  fVar6 = fVar58 - auVar43._0_4_;
  fVar7 = fVar58 - auVar46._0_4_;
  auVar41 = ZEXT416((uint)(fVar55 * 11.5 + auVar52._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  fVar58 = fVar58 - auVar47._0_4_;
  fVar59 = auVar48._0_4_;
  fVar55 = fVar59 - auVar45._0_4_;
  fVar8 = fVar59 - auVar43._0_4_;
  fVar9 = fVar59 - auVar46._0_4_;
  fVar10 = fVar59 - auVar41._0_4_;
  fVar11 = fVar59 - auVar47._0_4_;
  fVar12 = fVar59 - auVar49._0_4_;
  fVar13 = fVar59 - auVar50._0_4_;
  fVar59 = fVar59 - auVar40._0_4_;
  gauss_s1_c0[0] = expf(fVar60 * fVar2 * fVar2);
  gauss_s1_c0[1] = expf(fVar1 * fVar1 * fVar60);
  gauss_s1_c0[2] = expf(auVar44._0_4_ * auVar44._0_4_ * fVar60);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar60);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar4 * fVar4 * fVar60);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar60);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar60);
  gauss_s1_c0[8] = expf(fVar58 * fVar58 * fVar60);
  gauss_s1_c1[0] = expf(fVar55 * fVar55 * fVar60);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar60);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar60);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar60);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar60);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar60);
  gauss_s1_c1[7] = expf(fVar59 * fVar59 * fVar60);
  gauss_s1_c1[8] = expf(fVar10 * fVar10 * fVar60);
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  uVar28 = 0xfffffff8;
  fVar55 = 0.0;
  lVar29 = 0;
  local_84 = 0;
  pfVar22 = haarResponseX;
  pfVar16 = haarResponseY;
  do {
    uVar26 = (uint)uVar28;
    pfVar30 = gauss_s1_c0;
    lVar19 = (long)local_84;
    lVar29 = (long)(int)lVar29;
    if (uVar26 == 7) {
      pfVar30 = gauss_s1_c1;
    }
    if (uVar26 == 0xfffffff8) {
      pfVar30 = gauss_s1_c1;
    }
    uVar27 = 0xfffffff8;
    uVar32 = 0;
    local_84 = local_84 + 4;
    pfVar23 = pfVar22;
    pfVar35 = pfVar16;
    do {
      pfVar25 = gauss_s1_c0;
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar27 == 7) {
        pfVar25 = gauss_s1_c1;
      }
      if (uVar27 == 0xfffffff8) {
        pfVar25 = gauss_s1_c1;
      }
      uVar18 = (ulong)(uVar27 >> 0x1c & 0xfffffff8);
      uVar15 = uVar32;
      pfVar21 = pfVar23;
      pfVar36 = pfVar35;
      do {
        lVar17 = 0;
        pfVar37 = (float *)((long)pfVar30 + (ulong)(uint)((int)(uVar28 >> 0x1f) << 5));
        do {
          fVar1 = pfVar25[uVar18] * *pfVar37;
          pfVar37 = pfVar37 + (ulong)(~uVar26 >> 0x1f) * 2 + -1;
          auVar40 = vinsertps_avx(ZEXT416((uint)pfVar36[lVar17]),ZEXT416((uint)pfVar21[lVar17]),0x10
                                 );
          lVar17 = lVar17 + 1;
          auVar44._0_4_ = fVar1 * auVar40._0_4_;
          auVar44._4_4_ = fVar1 * auVar40._4_4_;
          auVar44._8_4_ = fVar1 * auVar40._8_4_;
          auVar44._12_4_ = fVar1 * auVar40._12_4_;
          auVar40 = vandps_avx(auVar44,auVar41);
          auVar40 = vmovlhps_avx(auVar44,auVar40);
          auVar42._0_4_ = auVar56._0_4_ + auVar40._0_4_;
          auVar42._4_4_ = auVar56._4_4_ + auVar40._4_4_;
          auVar42._8_4_ = auVar56._8_4_ + auVar40._8_4_;
          auVar42._12_4_ = auVar56._12_4_ + auVar40._12_4_;
          auVar56 = ZEXT1664(auVar42);
        } while (lVar17 != 9);
        uVar15 = uVar15 + 0x18;
        uVar18 = uVar18 + (ulong)(-1 < (int)uVar27) * 2 + -1;
        pfVar21 = pfVar21 + 0x18;
        pfVar36 = pfVar36 + 0x18;
      } while (uVar15 < uVar27 * 0x18 + 0x198);
      uVar27 = uVar27 + 5;
      uVar32 = uVar32 + 0x78;
      fVar1 = gauss_s2_arr[lVar19];
      auVar51._4_4_ = fVar1;
      auVar51._0_4_ = fVar1;
      auVar51._8_4_ = fVar1;
      auVar51._12_4_ = fVar1;
      auVar53 = vmulps_avx512vl(auVar42,auVar51);
      lVar19 = lVar19 + 1;
      auVar57._0_4_ = auVar53._0_4_ * auVar53._0_4_;
      auVar57._4_4_ = auVar53._4_4_ * auVar53._4_4_;
      auVar57._8_4_ = auVar53._8_4_ * auVar53._8_4_;
      auVar57._12_4_ = auVar53._12_4_ * auVar53._12_4_;
      auVar42 = vshufpd_avx(auVar53,auVar53,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar29) = auVar53;
      lVar29 = lVar29 + 4;
      pfVar23 = pfVar23 + 0x78;
      pfVar35 = pfVar35 + 0x78;
      auVar40 = vmovshdup_avx(auVar57);
      auVar52 = vfmadd231ss_fma(auVar40,auVar53,auVar53);
      auVar40 = vshufps_avx(auVar53,auVar53,0xff);
      auVar42 = vfmadd213ss_fma(auVar42,auVar42,auVar52);
      auVar40 = vfmadd213ss_fma(auVar40,auVar40,auVar42);
      fVar55 = fVar55 + auVar40._0_4_;
    } while (local_84 != (int)lVar19);
    pfVar22 = pfVar22 + 5;
    pfVar16 = pfVar16 + 5;
    uVar28 = (ulong)(uVar26 + 5);
  } while ((int)uVar26 < 3);
  if (fVar55 < 0.0) {
    fVar55 = sqrtf(fVar55);
  }
  else {
    auVar40 = vsqrtss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
    fVar55 = auVar40._0_4_;
  }
  lVar29 = 0;
  auVar56 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar55)));
  do {
    auVar54 = vmulps_avx512f(auVar56,*(undefined1 (*) [64])(ipoint->descriptor + lVar29));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar29) = auVar54;
    lVar29 = lVar29 + 0x10;
  } while (lVar29 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_rounding_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_pecompute_haar_rounding
        - replaced case statements with static arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary

    for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
        // int sample_y = (int) roundf(ipoint_y + l * scale);
        int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);// + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

        for (int k=-12, k_count=0; k<12; ++k, k_count++) {
            int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);// + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

            haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

        }

    }
        

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}